

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Individual.cpp
# Opt level: O2

Individual * __thiscall
Individual::makeOffspring(Individual *__return_storage_ptr__,Individual *this,Individual *mother)

{
  pointer piVar1;
  pointer piVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  reference pvVar6;
  int i;
  int iVar7;
  ulong __n;
  int iVar8;
  __shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &(this->usedInstance).super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>);
  Individual(__return_storage_ptr__,(shared_ptr<Instance> *)&local_40,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  piVar1 = (this->coresAsignedToTasks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar2 = (this->coresAsignedToTasks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = rand();
  iVar7 = (int)((ulong)((long)piVar1 - (long)piVar2) >> 2);
  iVar4 = rand();
  iVar8 = iVar7 - iVar4 % iVar7;
  iVar4 = iVar4 % iVar7 + iVar3 % iVar7;
  if (iVar7 <= iVar4) {
    iVar4 = iVar7;
  }
  iVar4 = iVar4 - iVar3 % iVar7;
  for (__n = 0; __n < (ulong)((long)(this->coresAsignedToTasks).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)(this->coresAsignedToTasks).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 2); __n = __n + 1) {
    uVar5 = rand();
    if (((uVar5 & 0x80000001) == 1 && 0 < iVar4) || (iVar8 == 0)) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::at(&this->coresAsignedToTasks,__n);
      std::vector<int,_std::allocator<int>_>::push_back
                (&__return_storage_ptr__->coresAsignedToTasks,pvVar6);
      iVar4 = iVar4 + -1;
    }
    else {
      pvVar6 = std::vector<int,_std::allocator<int>_>::at(&mother->coresAsignedToTasks,__n);
      std::vector<int,_std::allocator<int>_>::push_back
                (&__return_storage_ptr__->coresAsignedToTasks,pvVar6);
      iVar8 = iVar8 + -1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Individual Individual::makeOffspring(Individual& mother){
	Individual* individuals[2] = {this, &mother};
	Individual offspring(this->usedInstance);

	int numerOfTaks = coresAsignedToTasks.size();
	int startToUseOtherIndividualIdx = rand()%numerOfTaks;
	int fromFatherCount = rand()%numerOfTaks;
	int fromMotherCount=numerOfTaks-fromFatherCount;
	int endToUseOtherIndividualIdx = min(numerOfTaks, startToUseOtherIndividualIdx + fromFatherCount);
	fromFatherCount = endToUseOtherIndividualIdx - startToUseOtherIndividualIdx;


	for(int i = 0; i < coresAsignedToTasks.size(); i++){
		int randomnum=rand()%2;
		if((randomnum==1 && fromFatherCount>0)||fromMotherCount==0){
			offspring.coresAsignedToTasks.push_back( this->coresAsignedToTasks.at(i) );
			fromFatherCount--;
		}
		else{
			offspring.coresAsignedToTasks.push_back( mother.coresAsignedToTasks.at(i) );
			fromMotherCount--;
		}
	}

	return offspring;
}